

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkTSDA::IntToDescriptor
          (ChLinkTSDA *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  Index size;
  ActualDstType actualDst;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Index dstRows;
  ulong uVar16;
  ChVectorRef local_48;
  
  uVar4 = (ulong)off_v;
  iVar12 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if (((char)iVar12 == '\0') || (this->m_variables == (ChVariablesGenericDiagonalMass *)0x0)) {
    return;
  }
  uVar16 = (ulong)this->m_nstates;
  pdVar3 = (v->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar3 != (double *)0x0 && (long)uVar16 < 0) {
LAB_005aa75c:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if ((this->m_nstates < 0) ||
     ((long)((v->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
            uVar16) < (long)uVar4)) {
LAB_005aa77e:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  ChVariables::Get_qb(&local_48,&this->m_variables->super_ChVariables);
  if (local_48.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_8_ == uVar16) {
    uVar16 = local_48.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
    if (((local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)local_48.
                                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                         ._0_8_ >> 3) & 0x1fffffff) & 7),
       (long)local_48.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_ <= (long)uVar16)) {
      uVar16 = local_48.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_;
    }
    uVar14 = local_48.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_ - uVar16;
    uVar13 = uVar14 + 7;
    if (-1 < (long)uVar14) {
      uVar13 = uVar14;
    }
    if (0 < (long)uVar16) {
      uVar15 = 0;
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar15 * 8) = pdVar3[uVar4 + uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
    }
    uVar13 = (uVar13 & 0xfffffffffffffff8) + uVar16;
    if (7 < (long)uVar14) {
      do {
        pdVar2 = pdVar3 + uVar4 + uVar16;
        dVar5 = pdVar2[1];
        dVar6 = pdVar2[2];
        dVar7 = pdVar2[3];
        dVar8 = pdVar2[4];
        dVar9 = pdVar2[5];
        dVar10 = pdVar2[6];
        dVar11 = pdVar2[7];
        pdVar1 = (double *)
                 (local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._0_8_ + uVar16 * 8);
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar5;
        pdVar1[2] = dVar6;
        pdVar1[3] = dVar7;
        pdVar1[4] = dVar8;
        pdVar1[5] = dVar9;
        pdVar1[6] = dVar10;
        pdVar1[7] = dVar11;
        uVar16 = uVar16 + 8;
      } while ((long)uVar16 < (long)uVar13);
    }
    if ((long)uVar13 <
        (long)local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_) {
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar13 * 8) = pdVar3[uVar4 + uVar13];
        uVar13 = uVar13 + 1;
      } while (local_48.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ != uVar13);
    }
    uVar16 = (ulong)this->m_nstates;
    pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar3 != (double *)0x0 && (long)uVar16 < 0) goto LAB_005aa75c;
    if ((this->m_nstates < 0) ||
       ((long)((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              - uVar16) < (long)uVar4)) goto LAB_005aa77e;
    ChVariables::Get_fb(&local_48,&this->m_variables->super_ChVariables);
    if (local_48.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ == uVar16) {
      uVar16 = local_48.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_;
      if (((local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar16 = (ulong)(-((uint)((ulong)local_48.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7),
         (long)local_48.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ <= (long)uVar16)) {
        uVar16 = local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
      }
      uVar14 = local_48.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ - uVar16;
      uVar13 = uVar14 + 7;
      if (-1 < (long)uVar14) {
        uVar13 = uVar14;
      }
      if (0 < (long)uVar16) {
        uVar15 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar15 * 8) = pdVar3[uVar4 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
      uVar13 = (uVar13 & 0xfffffffffffffff8) + uVar16;
      if (7 < (long)uVar14) {
        do {
          pdVar2 = pdVar3 + uVar4 + uVar16;
          dVar5 = pdVar2[1];
          dVar6 = pdVar2[2];
          dVar7 = pdVar2[3];
          dVar8 = pdVar2[4];
          dVar9 = pdVar2[5];
          dVar10 = pdVar2[6];
          dVar11 = pdVar2[7];
          pdVar1 = (double *)
                   (local_48.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._0_8_ + uVar16 * 8);
          *pdVar1 = *pdVar2;
          pdVar1[1] = dVar5;
          pdVar1[2] = dVar6;
          pdVar1[3] = dVar7;
          pdVar1[4] = dVar8;
          pdVar1[5] = dVar9;
          pdVar1[6] = dVar10;
          pdVar1[7] = dVar11;
          uVar16 = uVar16 + 8;
        } while ((long)uVar16 < (long)uVar13);
      }
      if ((long)local_48.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ <= (long)uVar13) {
        return;
      }
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar13 * 8) = pdVar3[uVar4 + uVar13];
        uVar13 = uVar13 + 1;
      } while (local_48.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_ != uVar13);
      return;
    }
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

void ChLinkTSDA::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                 const ChStateDelta& v,
                                 const ChVectorDynamic<>& R,
                                 const unsigned int off_L,  // offset in L, Qc
                                 const ChVectorDynamic<>& L,
                                 const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    if (m_variables) {
        m_variables->Get_qb() = v.segment(off_v, m_nstates);
        m_variables->Get_fb() = R.segment(off_v, m_nstates);
    }
}